

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

sunrealtype arkUpperBoundH0(ARKodeMem ark_mem,sunrealtype tdist)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  N_Vector temp2;
  N_Vector temp1;
  sunrealtype hub;
  sunrealtype hub_inv;
  undefined8 local_20;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x268);
  uVar2 = *(undefined8 *)(in_RDI + 0x270);
  N_VAbs(*(undefined8 *)(in_RDI + 0x250),uVar2);
  (**(code **)(in_RDI + 0x58))(*(undefined8 *)(in_RDI + 0x250),uVar1,*(undefined8 *)(in_RDI + 0x60))
  ;
  N_VInv(uVar1,uVar1);
  N_VLinearSum(0x3fb999999999999a,0x3ff0000000000000,uVar2,uVar1,uVar1);
  N_VAbs(*(undefined8 *)(in_RDI + 600),uVar2);
  N_VDiv(uVar2,uVar1,uVar1);
  dVar3 = (double)N_VMaxNorm(uVar1);
  local_20 = in_XMM0_Qa * 0.1;
  if (1.0 < local_20 * dVar3) {
    local_20 = 1.0 / dVar3;
  }
  return local_20;
}

Assistant:

sunrealtype arkUpperBoundH0(ARKodeMem ark_mem, sunrealtype tdist)
{
  sunrealtype hub_inv, hub;
  N_Vector temp1, temp2;

  /* Bound based on |y0|/|y0'| -- allow at most an increase of
   * H0_UBFACTOR in y0 (based on a forward Euler step). The weight
   * factor is used as a safeguard against zero components in y0. */
  temp1 = ark_mem->tempv1;
  temp2 = ark_mem->tempv2;

  N_VAbs(ark_mem->yn, temp2);
  ark_mem->efun(ark_mem->yn, temp1, ark_mem->e_data);
  N_VInv(temp1, temp1);
  N_VLinearSum(H0_UBFACTOR, temp2, ONE, temp1, temp1);

  N_VAbs(ark_mem->fn, temp2);

  N_VDiv(temp2, temp1, temp1);
  hub_inv = N_VMaxNorm(temp1);

  /* bound based on tdist -- allow at most a step of magnitude
   * H0_UBFACTOR * tdist */
  hub = H0_UBFACTOR * tdist;

  /* Use the smaller of the two */
  if (hub * hub_inv > ONE) { hub = ONE / hub_inv; }

  return (hub);
}